

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O0

void init_streamclass(HSQUIRRELVM v)

{
  SQRESULT SVar1;
  HSQUIRRELVM in_RDI;
  SQRegFunction *f;
  SQInteger i;
  HSQUIRRELVM in_stack_00000018;
  HSQUIRRELVM in_stack_00000020;
  SQFUNCTION in_stack_00000028;
  HSQUIRRELVM in_stack_00000030;
  HSQUIRRELVM in_stack_00000038;
  SQChar *in_stack_00000048;
  SQInteger in_stack_00000050;
  HSQUIRRELVM in_stack_00000058;
  SQRegFunction *in_stack_ffffffffffffffe8;
  HSQUIRRELVM in_stack_fffffffffffffff0;
  
  sq_pushregistrytable((HSQUIRRELVM)0x14fab3);
  sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
  SVar1 = sq_get(in_RDI,(SQInteger)in_stack_fffffffffffffff0);
  if (SVar1 < 0) {
    sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
    sq_newclass(in_stack_00000038,(SQBool)in_stack_00000030);
    sq_settypetag((HSQUIRRELVM)i,(SQInteger)f,in_RDI);
    for (in_stack_fffffffffffffff0 = (HSQUIRRELVM)0x0;
        _stream_methods[(long)in_stack_fffffffffffffff0].name != (SQChar *)0x0;
        in_stack_fffffffffffffff0 =
             (HSQUIRRELVM)
             ((long)&(in_stack_fffffffffffffff0->super_SQCollectable).super_SQRefCounted.
                     _vptr_SQRefCounted + 1)) {
      in_stack_ffffffffffffffe8 = _stream_methods + (long)in_stack_fffffffffffffff0;
      sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
      sq_newclosure(in_stack_00000030,in_stack_00000028,(SQUnsignedInteger)in_stack_00000020);
      sq_setparamscheck(in_stack_00000058,in_stack_00000050,in_stack_00000048);
      sq_newslot(in_stack_00000018,(SQInteger)v,i);
    }
    sq_newslot(in_stack_00000018,(SQInteger)v,i);
    sq_pushroottable((HSQUIRRELVM)0x14fbee);
    sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
    sq_pushstring(in_stack_00000020,(SQChar *)in_stack_00000018,(SQInteger)v);
    sq_get(in_RDI,(SQInteger)in_stack_fffffffffffffff0);
    sq_newslot(in_stack_00000018,(SQInteger)v,i);
    sq_pop(in_stack_fffffffffffffff0,(SQInteger)in_stack_ffffffffffffffe8);
  }
  else {
    sq_pop(in_stack_fffffffffffffff0,(SQInteger)in_stack_ffffffffffffffe8);
  }
  sq_pop(in_stack_fffffffffffffff0,(SQInteger)in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void init_streamclass(HSQUIRRELVM v)
{
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_FAILED(sq_get(v,-2))) {
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_newclass(v,SQFalse);
        sq_settypetag(v,-1,(SQUserPointer)((SQUnsignedInteger)SQSTD_STREAM_TYPE_TAG));
        SQInteger i = 0;
        while(_stream_methods[i].name != 0) {
            const SQRegFunction &f = _stream_methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pushroottable(v);
        sq_pushstring(v,_SC("stream"),-1);
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_get(v,-4);
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);
    }
    else {
        sq_pop(v,1); //result
    }
    sq_pop(v,1);
}